

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O1

void __thiscall
leveldb::anon_unknown_1::PosixSequentialFile::~PosixSequentialFile(PosixSequentialFile *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  close(this->fd_);
  pcVar2 = (this->filename_)._M_dataplus._M_p;
  paVar1 = &(this->filename_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  SequentialFile::~SequentialFile(&this->super_SequentialFile);
  return;
}

Assistant:

~PosixSequentialFile() override { close(fd_); }